

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

ParsedNumber<unsigned_long_long> * QtPrivate::toUnsignedInteger(QByteArrayView data,int base)

{
  long lVar1;
  QByteArrayView num;
  bool bVar2;
  storage_type *in_RSI;
  ParsedNumber<unsigned_long_long> *in_RDI;
  long in_FS_OFFSET;
  QSimpleParsedNumber<unsigned_long_long> QVar3;
  QSimpleParsedNumber<unsigned_long_long> r;
  ParsedNumber<unsigned_long_long> *pPVar4;
  undefined1 *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar4 = in_RDI;
  bVar2 = QByteArrayView::isEmpty((QByteArrayView *)0x4b7c28);
  if (bVar2) {
    ParsedNumber<unsigned_long_long>::ParsedNumber(in_RDI);
  }
  else {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    num.m_data = in_RSI;
    num.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QVar3 = QLocaleData::bytearrayToUnsLongLong(num,(int)((ulong)pPVar4 >> 0x20));
    local_28 = (undefined1 *)QVar3.result;
    bVar2 = QSimpleParsedNumber<unsigned_long_long>::ok
                      ((QSimpleParsedNumber<unsigned_long_long> *)&local_28);
    if (bVar2) {
      ParsedNumber<unsigned_long_long>::ParsedNumber(in_RDI,(unsigned_long_long)local_28);
    }
    else {
      ParsedNumber<unsigned_long_long>::ParsedNumber(in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pPVar4;
  }
  __stack_chk_fail();
}

Assistant:

auto QtPrivate::toUnsignedInteger(QByteArrayView data, int base) -> ParsedNumber<qulonglong>
{
#if defined(QT_CHECK_RANGE)
    if (base != 0 && (base < 2 || base > 36)) {
        qWarning("QByteArray::toIntegral: Invalid base %d", base);
        base = 10;
    }
#endif
    if (data.isEmpty())
        return {};

    const QSimpleParsedNumber r = QLocaleData::bytearrayToUnsLongLong(data, base);
    if (r.ok())
        return ParsedNumber(r.result);
    return {};
}